

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char **ppcVar8;
  string *this;
  long lVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  int end_offset;
  int end_address;
  int start_offset;
  int start_address;
  ByteSwapWrapper swap_byte;
  string data_type;
  ostringstream error_message_8;
  ifstream ifs;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  char *local_400;
  string local_3f8;
  ByteSwapWrapper local_3d8;
  string local_3d0;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  iVar11 = 0;
  local_404 = 0;
  local_408 = 0;
  local_40c = -1;
  local_410 = -1;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"s","");
  do {
    iVar5 = ya_getopt_long(argc,argv,"S:s:E:e:h",(option *)0x0,(int *)0x0);
    if (100 < iVar5) {
      if (iVar5 == 0x65) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar3 = sptk::ConvertStringToInteger(&local_238,&local_410);
        bVar12 = -1 < local_410;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3 && bVar12) goto LAB_00103a02;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -e option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      }
      else {
        if (iVar5 == 0x68) {
          anon_unknown.dwarf_2199::PrintUsage((ostream *)&std::cout);
          iVar11 = 0;
          iVar5 = 1;
          goto LAB_00103ac5;
        }
        if (iVar5 != 0x73) goto LAB_00103998;
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar3 = sptk::ConvertStringToInteger(&local_238,&local_408);
        bVar12 = -1 < local_408;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3 && bVar12) goto LAB_00103a02;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -s option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
      }
      goto LAB_00103a89;
    }
    if (iVar5 == -1) {
      iVar5 = 2;
    }
    else if (iVar5 == 0x45) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_40c);
      bVar12 = local_40c < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar12) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -E option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103a89;
      }
LAB_00103a02:
      iVar5 = 0;
    }
    else if (iVar5 == 0x53) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_404);
      bVar12 = -1 < local_404;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar3 && bVar12) goto LAB_00103a02;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -S option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_00103a89:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar5 = 1;
      iVar11 = 1;
    }
    else {
LAB_00103998:
      iVar5 = 1;
      anon_unknown.dwarf_2199::PrintUsage((ostream *)&std::cerr);
      iVar11 = 1;
    }
LAB_00103ac5:
  } while (iVar5 == 0);
  if (iVar5 != 2) goto LAB_00103c20;
  if ((local_40c == -1) || (local_404 <= local_40c)) {
    if ((local_410 == -1) || (local_408 <= local_410)) {
      bVar3 = argc - ya_optind < 1;
      uVar6 = argc - ya_optind;
      if (uVar6 == 0 || argc < ya_optind) {
        local_400 = (char *)0x0;
      }
      else {
        ppcVar8 = argv + ((long)argc - (ulong)uVar6);
        local_400 = (char *)0x0;
        lVar9 = (ulong)uVar6 + 1;
        do {
          pcVar1 = *ppcVar8;
          if (*pcVar1 == '+') {
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            sVar7 = strlen(pcVar1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_238,pcVar1,pcVar1 + sVar7);
            std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_238);
            std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_3b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
              operator_delete(local_3b0[0]._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p);
            }
            bVar12 = true;
          }
          else if (local_400 == (char *)0x0) {
            bVar12 = true;
            local_400 = pcVar1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_238,"Too many input files",0x14);
            local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
            sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
              operator_delete(local_3b0[0]._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
            std::ios_base::~ios_base(local_1c8);
            iVar11 = 1;
            bVar12 = false;
          }
          if (!bVar12) break;
          lVar10 = lVar9 + -1;
          ppcVar8 = ppcVar8 + 1;
          lVar2 = lVar9 + -3;
          bVar3 = lVar10 < 2;
          lVar9 = lVar10;
        } while (SBORROW8(lVar10,2) == lVar2 < 0);
      }
      if (!bVar3) goto LAB_00103c20;
      bVar3 = sptk::SetBinaryMode();
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Cannot set translation mode",0x1b);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103be5;
      }
      this = &local_238;
      std::ifstream::ifstream(this);
      if ((local_400 == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_400),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          this = (string *)&std::cin;
        }
        anon_unknown.dwarf_2199::ByteSwapWrapper::ByteSwapWrapper
                  (&local_3d8,&local_3d0,local_404,local_408,local_40c,local_410);
        if (local_3d8.byte_swap_ == (ByteSwapInterface *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Unexpected argument for the +type option",0x28);
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"swab","");
          sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
LAB_00104045:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
          iVar11 = 1;
        }
        else {
          iVar5 = (*(local_3d8.byte_swap_)->_vptr_ByteSwapInterface[2])(local_3d8.byte_swap_,this);
          iVar11 = 0;
          if ((char)iVar5 == '\0') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,"Failed to swap bytes",0x14);
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"swab","");
            sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
            goto LAB_00104045;
          }
        }
        if (local_3d8.byte_swap_ != (ByteSwapInterface *)0x0) {
          (*(local_3d8.byte_swap_)->_vptr_ByteSwapInterface[1])(local_3d8.byte_swap_);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Cannot open file ",0x11);
        pcVar1 = local_400;
        sVar7 = strlen(local_400);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,pcVar1,sVar7);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"swab","");
        sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        iVar11 = 1;
      }
      std::ifstream::~ifstream(&local_238);
      goto LAB_00103c20;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"End offset number must be equal to or greater than ",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"start offset number",0x13);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"End address must be equal to or greater than ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"start address",0xd);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"swab","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
  }
LAB_00103be5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
    operator_delete(local_3b0[0]._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  iVar11 = 1;
LAB_00103c20:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  return iVar11;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_address(kDefaultStartAddress);
  int start_offset(kDefaultStartOffset);
  int end_address(kDefaultEndAddress);
  int end_offset(kDefaultEndOffset);
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "S:s:E:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &start_address) ||
            start_address < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_offset) ||
            start_offset < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToInteger(optarg, &end_address) ||
            end_address < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -E option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &end_offset) ||
            end_offset < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEnd != end_address && end_address < start_address) {
    std::ostringstream error_message;
    error_message << "End address must be equal to or greater than "
                  << "start address";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  if (kMagicNumberForEnd != end_offset && end_offset < start_offset) {
    std::ostringstream error_message;
    error_message << "End offset number must be equal to or greater than "
                  << "start offset number";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("swab", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("swab", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  ByteSwapWrapper swap_byte(data_type, start_address, start_offset, end_address,
                            end_offset);

  if (!swap_byte.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  if (!swap_byte.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to swap bytes";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  return 0;
}